

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.hxx
# Opt level: O1

void __thiscall nuraft::cluster_config::~cluster_config(cluster_config *this)

{
  pointer pcVar1;
  
  std::__cxx11::
  _List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ::_M_clear(&(this->servers_).
              super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            );
  pcVar1 = (this->user_ctx_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->user_ctx_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~cluster_config() {
    }